

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<short>,duckdb::HistogramBinFunction>
               (HistogramBinState<short> *source,HistogramBinState<short> *target,
               AggregateInputData *input_data)

{
  unsafe_vector<short> *puVar1;
  unsafe_vector<short> *puVar2;
  pointer __s1;
  pointer psVar3;
  pointer __s2;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  vector<short,_std::allocator<short>_> *this;
  unsafe_vector<idx_t> *puVar8;
  NotImplementedException *this_00;
  InternalException *this_01;
  long lVar9;
  size_t __n;
  long lVar10;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = source->bin_boundaries;
  if (puVar1 != (unsafe_vector<short> *)0x0) {
    puVar2 = target->bin_boundaries;
    if (puVar2 == (unsafe_vector<short> *)0x0) {
      this = (vector<short,_std::allocator<short>_> *)operator_new(0x18);
      (this->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      target->bin_boundaries = (unsafe_vector<short> *)this;
      puVar8 = (unsafe_vector<idx_t> *)operator_new(0x18);
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      target->counts = puVar8;
      std::vector<short,_std::allocator<short>_>::operator=
                (this,&source->bin_boundaries->super_vector<short,_std::allocator<short>_>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    __s1 = (puVar2->super_vector<short,_std::allocator<short>_>).
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
    psVar3 = (puVar2->super_vector<short,_std::allocator<short>_>).
             super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    __n = (long)psVar3 - (long)__s1;
    __s2 = (puVar1->super_vector<short,_std::allocator<short>_>).
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
    if (__n != (long)(puVar1->super_vector<short,_std::allocator<short>_>).
                     super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
LAB_00583b09:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
                 ,"");
      duckdb::NotImplementedException::NotImplementedException(this_00,(string *)local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (psVar3 != __s1) {
      iVar7 = bcmp(__s1,__s2,__n);
      if (iVar7 != 0) goto LAB_00583b09;
    }
    puVar4 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)puVar5 - (long)puVar4;
    puVar6 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (lVar9 != (long)(source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Histogram combine - bin boundaries are the same but counts are different","");
      duckdb::InternalException::InternalException(this_01,(string *)local_48);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (puVar5 != puVar4) {
      lVar9 = lVar9 >> 3;
      lVar10 = 0;
      do {
        puVar4[lVar10] = puVar4[lVar10] + puVar6[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}